

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O2

bool embree::operator==(Ref<embree::XML> *a,Ref<embree::XML> *b)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(&a->ptr->name,&b->ptr->name);
  if (_Var1) {
    bVar2 = std::operator==(&(a->ptr->parms)._M_t,&(b->ptr->parms)._M_t);
    if (bVar2) {
      bVar2 = std::operator==(&a->ptr->children,&b->ptr->children);
      if (bVar2) {
        bVar2 = std::operator==(&a->ptr->body,&b->ptr->body);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool operator ==( const Ref<XML>& a, const Ref<XML>& b ) {
      return a->name == b->name && a->parms == b->parms && a->children == b->children && a->body == b->body;
    }